

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

void __thiscall session::on_readable(session *this)

{
  buffer *this_00;
  socket_t fd;
  int iVar1;
  uint uVar2;
  char *data;
  ulong uVar3;
  
  if (this->closed_ == false) {
    this_00 = &this->recvbuf_;
    do {
      fd = this->fd_;
      data = buffer::tail(this_00);
      iVar1 = buffer::space(this_00);
      iVar1 = recv_data(fd,data,iVar1);
      if (iVar1 < 0) {
        uVar2 = get_network_err();
        uVar3 = (ulong)uVar2;
        if (uVar2 == 0) {
          return;
        }
LAB_0010792e:
        (*this->manager_->_vptr_imanager[1])
                  (this->manager_,(ulong)(uint)(this->super_iobject).netid_,uVar3);
        (*(this->network_->super_inetwork)._vptr_inetwork[5])
                  (this->network_,(ulong)(uint)(this->super_iobject).netid_);
        return;
      }
      if (iVar1 == 0) {
        uVar3 = 0;
        goto LAB_0010792e;
      }
      buffer::pop_space(this_00,iVar1);
      dispatch(this);
    } while (this->closed_ == false);
  }
  return;
}

Assistant:

void session::on_readable()
{
    while (!closed_)
    {
        int recv_len = recv_data(fd_, recvbuf_.tail(), recvbuf_.space());
        if (recv_len < 0)
        {
            int error = get_network_err();
            if (error != 0)
            {
                on_error(error);
                return;
            }
            break;
        }
        
        if (recv_len == 0)
        {
            on_error(0);
            return;
        }

        recvbuf_.pop_space(recv_len);
        this->dispatch();
    }
}